

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

void archive_entry_set_symlink(archive_entry *entry,char *linkname)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  if ((linkname != (char *)0x0) || ((entry->ae_set & L'\x01') == L'\0')) {
    archive_mstring_copy_mbs(&entry->ae_linkname,linkname);
    wVar1 = entry->ae_set & 0xfffffffc;
    wVar2 = wVar1 + L'\x02';
    if (linkname == (char *)0x0) {
      wVar2 = wVar1;
    }
    entry->ae_set = wVar2;
  }
  return;
}

Assistant:

void
archive_entry_set_symlink(struct archive_entry *entry, const char *linkname)
{
	if (linkname == NULL && (entry->ae_set & AE_SET_HARDLINK))
		return;
	archive_mstring_copy_mbs(&entry->ae_linkname, linkname);
	entry->ae_set &= ~AE_SET_HARDLINK;
	if (linkname == NULL)
		entry->ae_set &= ~AE_SET_SYMLINK;
	else
		entry->ae_set |= AE_SET_SYMLINK;
}